

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef names)

{
  ulong uVar1;
  IResultCapture *pIVar2;
  size_type sVar3;
  reference pvVar4;
  long in_RDI;
  char c;
  size_t pos;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  size_t start;
  anon_class_8_1_a855c668 skipq;
  anon_class_8_1_a855c668 trimmed;
  value_type *in_stack_fffffffffffffe68;
  stack<char,_std::deque<char,_std::allocator<char>_>_> *in_stack_fffffffffffffe70;
  string *this_00;
  OfType *in_stack_fffffffffffffe78;
  size_t start_00;
  SourceLineInfo *in_stack_fffffffffffffe80;
  StringRef *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  string local_100 [7];
  char in_stack_ffffffffffffff07;
  size_t in_stack_ffffffffffffff08;
  anon_class_8_1_a855c668 *in_stack_ffffffffffffff10;
  string local_d0 [39];
  char local_a9;
  ulong local_a8;
  size_t local_50;
  StringRef *local_48;
  StringRef *local_40;
  
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x128b36);
  pIVar2 = getResultCapture();
  *(IResultCapture **)(in_RDI + 0x18) = pIVar2;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  local_50 = 0;
  local_48 = (StringRef *)&stack0x00000008;
  local_40 = (StringRef *)&stack0x00000008;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>(in_stack_fffffffffffffe70);
  local_a8 = 0;
  do {
    uVar1 = local_a8;
    sVar3 = StringRef::size((StringRef *)&stack0x00000008);
    if (sVar3 <= uVar1) {
      std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
      emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
      start_00 = local_50;
      StringRef::size((StringRef *)&stack0x00000008);
      Capturer::anon_class_8_1_a855c668::operator()
                ((anon_class_8_1_a855c668 *)in_stack_fffffffffffffe80,start_00,
                 (size_t)in_stack_fffffffffffffe70);
      StringRef::operator_cast_to_string
                ((StringRef *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      pvVar4 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          in_stack_fffffffffffffe70);
      this_00 = local_100;
      std::__cxx11::string::operator=((string *)&pvVar4->message,this_00);
      std::__cxx11::string::~string(this_00);
      pvVar4 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_00
                         );
      std::__cxx11::string::operator+=((string *)&pvVar4->message," := ");
      clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x128f26);
      return;
    }
    local_a9 = StringRef::operator[]((StringRef *)&stack0x00000008,local_a8);
    if ((local_a9 == '\"') || (local_a9 == '\'')) {
      local_a8 = Capturer::anon_class_8_1_a855c668::operator()
                           (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff07);
    }
    else {
      if (local_a9 == '(') goto LAB_00128c84;
      if (local_a9 == ')') goto LAB_00128cc6;
      if (local_a9 == ',') {
        if ((local_50 != local_a8) &&
           (in_stack_fffffffffffffeaf =
                 clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::empty
                           ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x128d33),
           (bool)in_stack_fffffffffffffeaf)) {
          std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
          emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                    ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                     in_stack_fffffffffffffe78);
          Capturer::anon_class_8_1_a855c668::operator()
                    ((anon_class_8_1_a855c668 *)in_stack_fffffffffffffe80,
                     (size_t)in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70);
          StringRef::operator_cast_to_string
                    ((StringRef *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
          pvVar4 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                             ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                              in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe90 = local_d0;
          std::__cxx11::string::operator=((string *)&pvVar4->message,in_stack_fffffffffffffe90);
          std::__cxx11::string::~string(in_stack_fffffffffffffe90);
          pvVar4 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                             ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                              in_stack_fffffffffffffe70);
          std::__cxx11::string::operator+=((string *)&pvVar4->message," := ");
          local_50 = local_a8;
        }
        goto LAB_00128e22;
      }
      if (local_a9 == '[') {
LAB_00128c84:
        clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
      else {
        if (local_a9 != ']') {
          if (local_a9 == '{') goto LAB_00128c84;
          if (local_a9 != '}') goto LAB_00128e22;
        }
LAB_00128cc6:
        clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::pop
                  ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x128cd3);
      }
    }
LAB_00128e22:
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }